

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::SimpSolver(SimpSolver *this)

{
  ClauseAllocator *this_00;
  CRef CVar1;
  vec<Minisat::Lit,_int> dummy;
  
  Solver::Solver(&this->super_Solver);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_0011bd38;
  *(int32_t *)&(this->super_Solver).field_0x35c = opt_grow.value;
  this->clause_lim = opt_clause_lim.value;
  this->subsumption_lim = opt_subsumption_lim.value;
  this->simp_garbage_frac = opt_simp_garbage_frac.value;
  this->use_asymm = opt_use_asymm.value;
  this->use_rcheck = opt_use_rcheck.value;
  this->use_elim = opt_use_elim.value;
  this->extend_model = true;
  this->merges = 0;
  this->asymm_lits = 0;
  this->eliminated_vars = 0;
  this->elimorder = 1;
  this->use_simplification = true;
  this_00 = &(this->super_Solver).ca;
  (this->occurs).occs.map.data = (vec<unsigned_int,_int> *)0x0;
  (this->occurs).occs.map.sz = 0;
  (this->occurs).occs.map.cap = 0;
  (this->occurs).dirty.map.data = (char *)0x0;
  (this->occurs).dirty.map.sz = 0;
  (this->occurs).dirty.map.cap = 0;
  (this->occurs).dirties.data = (int *)0x0;
  (this->occurs).dirties.sz = 0;
  (this->occurs).dirties.cap = 0;
  (this->elimclauses).data = (uint *)0x0;
  (this->elimclauses).sz = 0;
  (this->elimclauses).cap = 0;
  (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->occurs).deleted.ca = this_00;
  (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data = (int *)0x0;
  (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.sz = 0;
  (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.cap = 0;
  (this->elim_heap).heap.data = (int *)0x0;
  (this->elim_heap).heap.sz = 0;
  (this->elim_heap).heap.cap = 0;
  (this->elim_heap).indices.map.data = (int *)0x0;
  (this->elim_heap).indices.map.sz = 0;
  (this->elim_heap).indices.map.cap = 0;
  (this->elim_heap).lt.n_occ = &this->n_occ;
  Queue<unsigned_int>::Queue(&this->subsumption_queue);
  (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  this->bwdsub_assigns = 0;
  this->n_touched = 0;
  (this->frozen_vars).data = (int *)0x0;
  (this->frozen_vars).sz = 0;
  (this->frozen_vars).cap = 0;
  (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  vec<Minisat::Lit,_int>::vec(&dummy,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.extra_clause_field = true;
  CVar1 = ClauseAllocator::alloc(this_00,&dummy,false);
  this->bwdsub_tmpunit = CVar1;
  (this->super_Solver).remove_satisfied = false;
  vec<Minisat::Lit,_int>::~vec(&dummy);
  return;
}

Assistant:

SimpSolver::SimpSolver() :
    grow               (opt_grow)
  , clause_lim         (opt_clause_lim)
  , subsumption_lim    (opt_subsumption_lim)
  , simp_garbage_frac  (opt_simp_garbage_frac)
  , use_asymm          (opt_use_asymm)
  , use_rcheck         (opt_use_rcheck)
  , use_elim           (opt_use_elim)
  , extend_model       (true)
  , merges             (0)
  , asymm_lits         (0)
  , eliminated_vars    (0)
  , elimorder          (1)
  , use_simplification (true)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (0)
  , n_touched          (0)
{
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
}